

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

JavascriptPromiseResolveOrRejectFunction * __thiscall
Js::JavascriptLibrary::CreatePromiseResolveOrRejectFunction
          (JavascriptLibrary *this,JavascriptMethod entryPoint,JavascriptPromise *promise,
          bool isReject,
          JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *alreadyResolvedRecord)

{
  ScriptContext *scriptContext;
  DynamicObject *prototype;
  JavascriptPromise *entryPoint_00;
  ScriptContext **ppSVar1;
  DynamicObject **ppDVar2;
  DynamicTypeHandler *typeHandler;
  Recycler *pRVar3;
  JavascriptPromiseResolveOrRejectFunction *this_00;
  Var pvVar4;
  InfoBitsWrapper<(Memory::ObjectInfoBits)1> local_71;
  TrackAllocData local_70;
  JavascriptPromiseResolveOrRejectFunction *local_48;
  JavascriptPromiseResolveOrRejectFunction *function;
  DynamicType *type;
  FunctionInfo *functionInfo;
  JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *alreadyResolvedRecord_local;
  JavascriptPromise *pJStack_20;
  bool isReject_local;
  JavascriptPromise *promise_local;
  JavascriptMethod entryPoint_local;
  JavascriptLibrary *this_local;
  
  type = (DynamicType *)JavascriptPromise::EntryInfo::ResolveOrRejectFunction;
  functionInfo = (FunctionInfo *)alreadyResolvedRecord;
  alreadyResolvedRecord_local._7_1_ = isReject;
  pJStack_20 = promise;
  promise_local = (JavascriptPromise *)entryPoint;
  entryPoint_local = (JavascriptMethod)this;
  ppSVar1 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
  scriptContext = *ppSVar1;
  ppDVar2 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).functionPrototype);
  entryPoint_00 = promise_local;
  prototype = *ppDVar2;
  typeHandler = GetDeferredAnonymousFunctionTypeHandler(this);
  function = (JavascriptPromiseResolveOrRejectFunction *)
             DynamicType::New(scriptContext,TypeIds_Function,&prototype->super_RecyclableObject,
                              (JavascriptMethod)entryPoint_00,typeHandler,false,false);
  pRVar3 = GetRecycler(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_70,(type_info *)&JavascriptPromiseResolveOrRejectFunction::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x19e2);
  pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_70);
  this_00 = (JavascriptPromiseResolveOrRejectFunction *)
            new<(Memory::ObjectInfoBits)1>(0x58,pRVar3,&local_71);
  JavascriptPromiseResolveOrRejectFunction::JavascriptPromiseResolveOrRejectFunction
            (this_00,(DynamicType *)function,(FunctionInfo *)type,pJStack_20,
             (bool)(alreadyResolvedRecord_local._7_1_ & 1),
             (JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *)functionInfo);
  local_48 = this_00;
  pvVar4 = TaggedInt::ToVarUnchecked(1);
  (*(this_00->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.
    super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(this_00,0xd1,pvVar4,2,0,0,0xf);
  return local_48;
}

Assistant:

JavascriptPromiseResolveOrRejectFunction* JavascriptLibrary::CreatePromiseResolveOrRejectFunction(JavascriptMethod entryPoint, JavascriptPromise* promise, bool isReject, JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper* alreadyResolvedRecord)
    {
        FunctionInfo* functionInfo = &Js::JavascriptPromise::EntryInfo::ResolveOrRejectFunction;
        DynamicType* type = DynamicType::New(scriptContext, TypeIds_Function, functionPrototype, entryPoint, GetDeferredAnonymousFunctionTypeHandler());
        JavascriptPromiseResolveOrRejectFunction* function = RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, JavascriptPromiseResolveOrRejectFunction, type, functionInfo, promise, isReject, alreadyResolvedRecord);

        function->SetPropertyWithAttributes(PropertyIds::length, TaggedInt::ToVarUnchecked(1), PropertyConfigurable, nullptr);

        return function;
    }